

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

Path * find_path(Path *__return_storage_ptr__,Grid *grid)

{
  GridNode *b;
  GridNode **ppGVar1;
  int iVar2;
  int iVar3;
  GridNode *item;
  GridNode *pGVar4;
  ostream *poVar5;
  GridNode *item_00;
  int iVar6;
  int i;
  long lVar7;
  NODE_STATE NVar8;
  Heap openList;
  Heap closedList;
  
  item = Grid::get_start_node(grid);
  pGVar4 = Grid::get_target_node(grid);
  openList.maxCount = 0xe1;
  openList.list = (GridNode **)operator_new__(0x708);
  openList.count = 0;
  closedList.maxCount = 0xe1;
  closedList.list = (GridNode **)operator_new__(0x708);
  closedList.count = 0;
  Heap::add_to_heap(&openList,item);
  iVar6 = 0;
  while (0 < openList.count) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    item_00 = Heap::remove_first(&openList);
    Heap::add_to_heap(&closedList,item_00);
    poVar5 = std::operator<<((ostream *)&std::cout,"Current Node:");
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(item_00->pos).x);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(item_00->pos).y);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    if (item_00 == pGVar4) break;
    iVar6 = iVar6 + 1;
    for (lVar7 = 0; lVar7 < item_00->neighbourCount; lVar7 = lVar7 + 1) {
      b = (item_00->neighbours).super__Vector_base<GridNode_*,_std::allocator<GridNode_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7];
      NVar8 = b->state;
      if ((NVar8 != BLOCKED) && ((closedList.count < 1 || (closedList.list[b->index] != b)))) {
        iVar3 = item_00->gCost;
        iVar2 = get_distance_bw_nodes(item_00,b);
        ppGVar1 = openList.list;
        iVar2 = iVar2 + iVar3;
        if (openList.count < 1) {
          b->gCost = iVar2;
          iVar3 = get_distance_bw_nodes(pGVar4,b);
          b->hCost = iVar3;
          b->parent = item_00;
LAB_0010180c:
          if (b != pGVar4) {
            NVar8 = NEIGHBOUR;
          }
          b->state = NVar8;
          Heap::add_to_heap(&openList,b);
        }
        else {
          iVar3 = b->index;
          if ((openList.list[iVar3] != b) || (iVar2 < b->gCost)) {
            b->gCost = iVar2;
            iVar2 = get_distance_bw_nodes(pGVar4,b);
            b->hCost = iVar2;
            b->parent = item_00;
            if (ppGVar1[iVar3] != b) goto LAB_0010180c;
            Heap::sort_up(&openList,b);
          }
        }
      }
    }
    if (item_00 != item) {
      item_00->state = CHECKED;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Path Found!!!");
  std::endl<char,std::char_traits<char>>(poVar5);
  __return_storage_ptr__->number = 0;
  (__return_storage_ptr__->grids).count = 0;
  (__return_storage_ptr__->grids).capacity = 0;
  pGVar4 = pGVar4->parent;
  while (pGVar4 != item) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Path Node:");
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pGVar4->pos).x);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pGVar4->pos).y);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
    NodeList::add_node(&__return_storage_ptr__->grids,pGVar4);
    pGVar4 = pGVar4->parent;
    __return_storage_ptr__->number = __return_storage_ptr__->number + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Path find_path(Grid *grid)
{
    // Setup nodes
    GridNode *startNode = grid->get_start_node();
    GridNode *targetNode = grid->get_target_node();

    // Calculate Path

#if USE_HEAPS
    Heap openList;
    Heap closedList;
    openList.add_to_heap(startNode);
#else
    NodeList openList;
    NodeList closedList;
    openList.add_node(startNode);
#endif
    int iteration = 0;
    while (openList.count > 0)
    {
        std::cout << "Iteration: " << iteration << std::endl;
        iteration++;
// Find Current Node
#if USE_HEAPS
        GridNode *currentNode = openList.remove_first();
        closedList.add_to_heap(currentNode);
#else
        GridNode *currentNode = openList.get_current_node();
        openList.remove_node(currentNode);
        closedList.add_node(currentNode);
#endif
        std::cout << "Current Node:"
                  << "(" << currentNode->pos.x << "," << currentNode->pos.y << ")" << std::endl;
        if (currentNode == targetNode)
        {
            break;
        }
        // Check Neighbours
        for (int i = 0; i < currentNode->neighbourCount; i++)
        {
            GridNode *neighbour = currentNode->neighbours[i];
            if (neighbour->is_traversable() && !closedList.has_node(neighbour))
            {
                int moveCost = currentNode->gCost + get_distance_bw_nodes(currentNode, neighbour);
                if (!openList.has_node(neighbour) || moveCost < neighbour->gCost)
                {
                    neighbour->gCost = moveCost;
                    neighbour->hCost = get_distance_bw_nodes(targetNode, neighbour);
                    neighbour->parent = currentNode;
                    if (!openList.has_node(neighbour))
                    {
                        neighbour->state = (neighbour != targetNode) ? NEIGHBOUR : neighbour->state;
#if USE_HEAPS
                        openList.add_to_heap(neighbour);
#else
                        openList.add_node(neighbour);
#endif
                    }
                    else
                    {
#if USE_HEAPS
                        openList.update_item(neighbour);
#else
                        set_cost(neighbour, startNode, targetNode);
#endif
                    }
                }
            }
        }
        if (currentNode != startNode)
        {
            currentNode->state = CHECKED;
        }
    }
    std::cout << "Path Found!!!" << std::endl;

    // Setup Path
    Path p;
    GridNode *node = targetNode->parent;
    while (node != startNode)
    {
        std::cout << "Path Node:"
                  << "(" << node->pos.x << "," << node->pos.y << ")" << std::endl;
        p.grids.add_node(node);
        node = node->parent;
        p.number++;
    }
    return p;
}